

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimRelPrint(Gia_Man_t *p,Vec_Wrd_t *vRel,Vec_Int_t *vOutMints)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  iVar3 = p->vSimsPi->nSize / p->vCis->nSize;
  iVar1 = vRel->nSize / iVar3;
  iVar4 = iVar3 << 6;
  iVar6 = 0;
  if (0 < iVar1) {
    iVar6 = iVar1;
  }
  if (iVar3 << 6 < 1) {
    iVar4 = 0;
  }
  uVar2 = 0;
  for (iVar3 = 0; iVar3 != iVar4; iVar3 = iVar3 + 1) {
    uVar7 = 0;
    iVar8 = iVar6;
    uVar5 = uVar2;
    while( true ) {
      bVar9 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      if (bVar9) break;
      printf("%d",(ulong)((vRel->pArray[(int)uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0));
      uVar7 = (ulong)((int)uVar7 +
                     (uint)((vRel->pArray[(int)uVar5 >> 6] >> ((ulong)uVar5 & 0x3f) & 1) != 0));
      uVar5 = uVar5 + 1;
    }
    printf("  Count = %2d \n",uVar7);
    uVar2 = uVar2 + iVar1;
  }
  return;
}

Assistant:

void Gia_ManSimRelPrint( Gia_Man_t * p, Vec_Wrd_t * vRel, Vec_Int_t * vOutMints )
{
    int nWords = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    int nMints = Vec_WrdSize(vRel) / nWords; 
    int i, m, Count;
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        int k;
        for ( k = 0; k < Gia_ManCiNum(p); k++ )
            printf( "%d", Abc_TtGetBit( Vec_WrdEntryP(p->vSimsPi, k), i ) );
        printf( " " );
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d ", Count );
        if ( vOutMints )
        {
            printf( "   %3d ", Vec_IntEntry(vOutMints, i) );
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+Vec_IntEntry(vOutMints, i) ) )
                printf( "yes" );
            else
                printf( "no" );
        }
        printf( "\n" );
    }
*/
/*
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        printf( "%d ", Count );
    }
    printf( "\n" );
*/
    for ( i = 0; i < 64 * nWords; i++ )
    {
        Count = 0;
        for ( m = 0; m < nMints; m++ )
        {
            printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            Count += Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m );
        }
        printf( "  Count = %2d \n", Count );
    }
}